

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapetriang.cpp
# Opt level: O0

void pzshape::TPZShapeTriang::ShapeGenerating
               (TPZVec<double> *pt,TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double *pdVar10;
  double row;
  TPZFMatrix<double> *this;
  REAL mult [7];
  int is3;
  int is2;
  int is1;
  int is2_1;
  int is1_1;
  int is;
  int64_t in_stack_fffffffffffffea0;
  double dVar11;
  int64_t in_stack_fffffffffffffea8;
  TPZFMatrix<double> *in_stack_fffffffffffffeb0;
  double local_68 [7];
  undefined4 local_30;
  undefined4 local_2c;
  undefined4 local_28;
  int local_24;
  int local_20;
  int local_1c;
  
  for (local_1c = 3; local_1c < 6; local_1c = local_1c + 1) {
    local_20 = local_1c % 3;
    local_24 = (local_1c + 1) % 3;
    pdVar10 = TPZFMatrix<double>::operator()
                        (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                         in_stack_fffffffffffffea0);
    dVar11 = *pdVar10;
    pdVar10 = TPZFMatrix<double>::operator()
                        (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                         in_stack_fffffffffffffea0);
    dVar1 = *pdVar10;
    pdVar10 = TPZFMatrix<double>::operator()
                        (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                         in_stack_fffffffffffffea0);
    *pdVar10 = dVar11 * dVar1;
    pdVar10 = TPZFMatrix<double>::operator()
                        (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                         in_stack_fffffffffffffea0);
    dVar11 = *pdVar10;
    pdVar10 = TPZFMatrix<double>::operator()
                        (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                         in_stack_fffffffffffffea0);
    dVar1 = *pdVar10;
    pdVar10 = TPZFMatrix<double>::operator()
                        (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                         in_stack_fffffffffffffea0);
    dVar2 = *pdVar10;
    pdVar10 = TPZFMatrix<double>::operator()
                        (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                         in_stack_fffffffffffffea0);
    dVar3 = *pdVar10;
    pdVar10 = TPZFMatrix<double>::operator()
                        (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                         in_stack_fffffffffffffea0);
    *pdVar10 = dVar11 * dVar1 + dVar2 * dVar3;
    pdVar10 = TPZFMatrix<double>::operator()
                        (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                         in_stack_fffffffffffffea0);
    dVar11 = *pdVar10;
    pdVar10 = TPZFMatrix<double>::operator()
                        (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                         in_stack_fffffffffffffea0);
    dVar1 = *pdVar10;
    pdVar10 = TPZFMatrix<double>::operator()
                        (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                         in_stack_fffffffffffffea0);
    dVar2 = *pdVar10;
    pdVar10 = TPZFMatrix<double>::operator()
                        (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                         in_stack_fffffffffffffea0);
    dVar3 = *pdVar10;
    pdVar10 = TPZFMatrix<double>::operator()
                        (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                         in_stack_fffffffffffffea0);
    *pdVar10 = dVar11 * dVar1 + dVar2 * dVar3;
  }
  local_28 = 0;
  local_2c = 1;
  local_30 = 2;
  pdVar10 = TPZFMatrix<double>::operator()
                      (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0
                      );
  dVar11 = *pdVar10;
  pdVar10 = TPZFMatrix<double>::operator()
                      (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,(int64_t)dVar11);
  row = dVar11 * *pdVar10;
  pdVar10 = TPZFMatrix<double>::operator()(in_stack_fffffffffffffeb0,(int64_t)row,(int64_t)dVar11);
  this = (TPZFMatrix<double> *)(row * *pdVar10);
  pdVar10 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)dVar11);
  *pdVar10 = (double)this;
  pdVar10 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)dVar11);
  dVar1 = *pdVar10;
  pdVar10 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)dVar11);
  dVar2 = *pdVar10;
  pdVar10 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)dVar11);
  dVar3 = *pdVar10;
  pdVar10 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)dVar11);
  dVar4 = *pdVar10;
  pdVar10 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)dVar11);
  dVar5 = *pdVar10;
  pdVar10 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)dVar11);
  dVar6 = *pdVar10;
  pdVar10 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)dVar11);
  dVar7 = *pdVar10;
  pdVar10 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)dVar11);
  dVar8 = *pdVar10;
  pdVar10 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)dVar11);
  dVar9 = *pdVar10;
  pdVar10 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)dVar11);
  *pdVar10 = dVar7 * dVar8 * dVar9 + dVar1 * dVar2 * dVar3 + dVar4 * dVar5 * dVar6;
  pdVar10 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)dVar11);
  dVar1 = *pdVar10;
  pdVar10 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)dVar11);
  dVar2 = *pdVar10;
  pdVar10 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)dVar11);
  dVar3 = *pdVar10;
  pdVar10 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)dVar11);
  dVar4 = *pdVar10;
  pdVar10 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)dVar11);
  dVar5 = *pdVar10;
  pdVar10 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)dVar11);
  dVar6 = *pdVar10;
  pdVar10 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)dVar11);
  dVar7 = *pdVar10;
  pdVar10 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)dVar11);
  dVar8 = *pdVar10;
  pdVar10 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)dVar11);
  dVar9 = *pdVar10;
  pdVar10 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)dVar11);
  *pdVar10 = dVar7 * dVar8 * dVar9 + dVar1 * dVar2 * dVar3 + dVar4 * dVar5 * dVar6;
  memcpy(local_68,&DAT_02098320,0x38);
  for (local_1c = 3; local_1c < 7; local_1c = local_1c + 1) {
    dVar1 = local_68[local_1c];
    pdVar10 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)dVar11);
    *pdVar10 = dVar1 * *pdVar10;
    dVar1 = local_68[local_1c];
    pdVar10 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)dVar11);
    *pdVar10 = dVar1 * *pdVar10;
    dVar1 = local_68[local_1c];
    pdVar10 = TPZFMatrix<double>::operator()(this,(int64_t)row,(int64_t)dVar11);
    *pdVar10 = dVar1 * *pdVar10;
  }
  return;
}

Assistant:

void TPZShapeTriang::ShapeGenerating(const TPZVec<REAL> &pt, TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &dphi)
	{
		int is;
		for(is=3; is<6; is++)
		{
			int is1 = is%3;
			int is2 = (is+1)%3;
			phi(is,0) = phi(is1,0)*phi(is2,0);
			dphi(0,is) = dphi(0,is1)*phi(is2,0)+phi(is1,0)*dphi(0,is2);
			dphi(1,is) = dphi(1,is1)*phi(is2,0)+phi(is1,0)*dphi(1,is2);
		}
		int is1 = 0;
		int is2 = 1;
		int is3 = 2;
		phi(is,0) = phi(is1,0)*phi(is2,0)*phi(is3,0);
		dphi(0,is) = dphi(0,is1)*phi(is2,0)*phi(is3,0)+phi(is1,0)*dphi(0,is2)*phi(is3,0)+phi(is1,0)*phi(is2,0)*dphi(0,is3);
		dphi(1,is) = dphi(1,is1)*phi(is2,0)*phi(is3,0)+phi(is1,0)*dphi(1,is2)*phi(is3,0)+phi(is1,0)*phi(is2,0)*dphi(1,is3);

		// Make the generating shape functions linear and unitary
		REAL mult[] = {1.,1.,1.,4.,4.,4.,27.};
		for(is=3;is<NSides; is++)
		{
			phi(is,0) *= mult[is];
			dphi(0,is) *= mult[is];
			dphi(1,is) *= mult[is];
		}

		
	}